

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldBase::
InitializeKeyValue<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
          (MapFieldBase *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
          basic_string_view<char,_std::char_traits<char>_> *init)

{
  Arena *pAVar1;
  ThreadSafeArena *this_00;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)v,init,&local_11);
  pAVar1 = arena(this);
  if (pAVar1 != (Arena *)0x0) {
    this_00 = &arena(this)->impl_;
    ThreadSafeArena::AddCleanup(this_00,v,cleanup::arena_destruct_object<std::__cxx11::string>);
  }
  return;
}

Assistant:

void InitializeKeyValue(T* v, const U&... init) {
    ::new (static_cast<void*>(v)) T(init...);
    if constexpr (std::is_same_v<std::string, T>) {
      if (arena() != nullptr) {
        arena()->OwnDestructor(v);
      }
    }
  }